

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v9::detail::snprintf_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  uint uVar2;
  undefined2 *puVar3;
  _func_int **pp_Var4;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar5;
  int iVar6;
  ulong __maxlen;
  char format [7];
  char local_4b;
  undefined1 local_4a [2];
  undefined1 local_48 [4];
  longdouble local_44;
  long local_38;
  
  local_44 = value;
  local_4b = '%';
  if ((specs._4_4_ >> 0x13 & 1) == 0) {
    puVar3 = (undefined2 *)local_4a;
  }
  else {
    puVar3 = (undefined2 *)(local_4a + 1);
    local_4a[0] = 0x23;
  }
  if (-1 < precision) {
    *puVar3 = 0x2a2e;
    puVar3 = puVar3 + 1;
  }
  *(undefined1 *)puVar3 = 0x4c;
  *(byte *)((long)puVar3 + 1) = ((specs._4_4_ >> 0x10 & 1) == 0) << 5 | 0x41;
  *(undefined1 *)(puVar3 + 1) = 0;
  sVar1 = buf->size_;
  local_38 = sVar1 + 1;
  do {
    __maxlen = buf->capacity_ - sVar1;
    if (precision < 0) {
      uVar2 = snprintf(buf->ptr_ + sVar1,__maxlen,&local_4b);
    }
    else {
      uVar2 = snprintf(buf->ptr_ + sVar1,__maxlen,&local_4b,precision,in_R8,in_R9,local_44);
    }
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 < 0) {
      iVar6 = 3;
      if (buf->capacity_ != 0xffffffffffffffff) {
        uVar5 = buf->capacity_ + 1;
        pp_Var4 = buf->_vptr_buffer;
        iVar6 = 3;
LAB_00123ffe:
        (**pp_Var4)(buf,uVar5);
      }
    }
    else if (uVar5 < __maxlen) {
      uVar5 = uVar5 + sVar1;
      if (buf->capacity_ < uVar5) {
        (**buf->_vptr_buffer)(buf,uVar5);
      }
      if (buf->capacity_ < uVar5) {
        uVar5 = buf->capacity_;
      }
      buf->size_ = uVar5;
      iVar6 = 1;
    }
    else {
      uVar5 = uVar5 + local_38;
      iVar6 = 0;
      if (buf->capacity_ < uVar5) {
        pp_Var4 = buf->_vptr_buffer;
        iVar6 = 0;
        goto LAB_00123ffe;
      }
    }
    if ((iVar6 != 0) && (iVar6 != 3)) {
      return 0;
    }
  } while( true );
}

Assistant:

auto snprintf_float(T value, int precision, float_specs specs,
                    buffer<char>& buf) -> int {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  FMT_ASSERT(specs.format == float_format::hex, "");
  static_assert(!std::is_same<T, float>::value, "");

  // Build the format string.
  char format[7];  // The longest format is "%#.*Le".
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.upper ? 'A' : 'a';
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
    abort_fuzzing_if(precision > 100000);
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size < capacity) {
      buf.try_resize(size + offset);
      return 0;
    }
    buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
  }
}